

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_parser.cpp
# Opt level: O1

void __thiscall
Parser_parseOrdModelFromFile_Test::~Parser_parseOrdModelFromFile_Test
          (Parser_parseOrdModelFromFile_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, parseOrdModelFromFile)
{
    libcellml::ParserPtr p = libcellml::Parser::create();
    libcellml::ModelPtr model = p->parseModel(fileContents("Ohara_Rudy_2011.cellml"));

    EXPECT_EQ(size_t(0), p->issueCount());

    // Test some random values.
    std::string a = model->component("intracellular_ions")->variable("BSLmax")->initialValue();
    EXPECT_EQ("1.124", a);

    a = model->component("INa")->variable("mtD2")->initialValue();
    EXPECT_EQ("8.552", a);

    a = model->component("IK1")->variable("GK1_b")->initialValue();
    EXPECT_EQ("0.1908", a);

    a = model->component("SERCA")->variable("Jup")->interfaceType();
    EXPECT_EQ("public", a);
}